

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O2

string * __thiscall
fasttext::Args::lossToString_abi_cxx11_(string *__return_storage_ptr__,Args *this,loss_name ln)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(ln) {
  case hs:
    pcVar2 = "hs";
    paVar1 = &local_9;
    break;
  case ns:
    pcVar2 = "ns";
    paVar1 = &local_a;
    break;
  case softmax:
    pcVar2 = "softmax";
    paVar1 = &local_b;
    break;
  case ova:
    pcVar2 = "one-vs-all";
    paVar1 = &local_c;
    break;
  default:
    pcVar2 = "Unknown loss!";
    paVar1 = &local_d;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Args::lossToString(loss_name ln) const {
  switch (ln) {
    case loss_name::hs:
      return "hs";
    case loss_name::ns:
      return "ns";
    case loss_name::softmax:
      return "softmax";
    case loss_name::ova:
      return "one-vs-all";
  }
  return "Unknown loss!"; // should never happen
}